

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedObservableDictionary.hpp
# Opt level: O0

bool __thiscall
SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::ContainsKey(SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *this,int *key)

{
  bool bVar1;
  element_type *__m;
  _Self local_40 [3];
  _Self local_28;
  lock_guard<std::recursive_mutex> local_20;
  Lock l;
  int *key_local;
  SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  l._M_device = (mutex_type *)key;
  __m = std::__shared_ptr_access<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator*((__shared_ptr_access<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   *)&this->_mutex);
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,__m);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->_map,(key_type *)l._M_device);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->_map);
  bVar1 = std::operator!=(&local_28,local_40);
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return bVar1;
}

Assistant:

virtual bool ContainsKey(const Key_& key) const
    {
        Lock l(*_mutex);
        return _map.find(key) != _map.end();
    }